

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::AsmJsByteCodeWriter::AsmReg11
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,
          RegSlot R4,RegSlot R5,RegSlot R6,RegSlot R7,RegSlot R8,RegSlot R9,RegSlot R10)

{
  Data *this_00;
  bool bVar1;
  RegSlot local_6c;
  RegSlot local_68;
  RegSlot local_64;
  RegSlot local_60;
  RegSlot local_5c;
  RegSlot local_58;
  RegSlot local_54;
  RegSlot local_50;
  RegSlot local_4c;
  RegSlot local_48;
  RegSlot local_44;
  ByteCodeWriter *local_40;
  RegSlot local_38;
  RegSlot local_34;
  
  local_40 = &this->super_ByteCodeWriter;
  local_38 = R3;
  local_34 = R2;
  bVar1 = TryWriteAsmReg11<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op,R0,R1,R2,R3,R4,R5,R6,R7,R8,R9,R10);
  if (!bVar1) {
    bVar1 = TryWriteAsmReg11<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      ((AsmJsByteCodeWriter *)local_40,op,R0,R1,local_34,local_38,R4,R5,R6,R7,R8,R9,
                       R10);
    if (!bVar1) {
      local_64 = local_34;
      local_60 = local_38;
      local_5c = R4;
      local_58 = R5;
      local_54 = R6;
      local_50 = R7;
      local_4c = R8;
      local_48 = R9;
      local_44 = R10;
      this_00 = &local_40->m_byteCodeData;
      local_6c = R0;
      local_68 = R1;
      ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>(this_00,op,local_40,false);
      ByteCodeWriter::Data::Write(this_00,&local_6c,0x2c);
    }
  }
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmReg11(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, RegSlot R5, RegSlot R6, RegSlot R7, RegSlot R8, RegSlot R9, RegSlot R10)
    {
        MULTISIZE_LAYOUT_WRITE(AsmReg11, op, R0, R1, R2, R3, R4, R5, R6, R7, R8, R9, R10);
    }